

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twolevel.c
# Opt level: O1

void miss_promote(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  size_t sVar3;
  size_t local_38;
  size_t vsize;
  
  lVar2 = vmemcache_get(arg,key,key_size,0,0,0,&local_38);
  sVar3 = local_38;
  if (lVar2 == 0) {
    __ptr = malloc(local_38);
    if (__ptr != (void *)0x0) {
      sVar3 = vmemcache_get(arg,key,key_size,__ptr,sVar3,0,0);
      if (sVar3 == local_38) {
        iVar1 = vmemcache_put(cache,key,key_size,__ptr);
        if (iVar1 == 0) {
          vmemcache_evict(arg,key,key_size);
        }
      }
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void
miss_promote(VMEMcache *cache, const void *key, size_t key_size, void *arg)
{
	VMEMcache *colder = (VMEMcache *)arg;

	size_t vsize;
	if (vmemcache_get(colder, key, key_size, NULL, 0, 0, &vsize)) {
		/*
		 * Second-level cache miss.
		 *
		 * You may want to handle it somehow here.
		 */
		return;
	}
	void *buf = malloc(vsize);
	if (!buf)
		return;
	if (vmemcache_get(colder, key, key_size, buf, vsize, 0, NULL) ==
		(ssize_t)vsize) {
		/*
		 * Note that there's no lock, thus our entry may disappear
		 * between these two get() calls.
		 */
		if (!vmemcache_put(cache, key, key_size, buf, vsize)) {
			/*
			 * Put can legitimately fail: value too big for
			 * upper-level cache, no space because all evictable
			 * keys are busy, etc.
			 *
			 * The promotion likely cascades into one or more
			 * demotions to migrate cold keys downwards, to make
			 * space.
			 */
			/*
			 * You may or may not want to evict from cold cache
			 * here.
			 */
			vmemcache_evict(colder, key, key_size);
		}
	}
	free(buf);
}